

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

bool __thiscall
PruneReplayer::enqueue_create_raytracing_pipeline
          (PruneReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  VkPipeline *ppVVar1;
  bool bVar2;
  VkPipeline_T *pVVar3;
  size_type sVar4;
  size_type sVar5;
  mapped_type *ppVVar6;
  key_type local_58;
  key_type local_50;
  uint local_48;
  byte local_41;
  uint32_t i_2;
  bool has_default_allowed_library;
  uint local_34;
  uint local_30;
  uint32_t i_1;
  uint32_t i;
  bool allow_pipeline;
  VkPipeline *pipeline_local;
  VkRayTracingPipelineCreateInfoKHR *create_info_local;
  Hash hash_local;
  PruneReplayer *this_local;
  
  _i = pipeline;
  pipeline_local = (VkPipeline *)create_info;
  create_info_local = (VkRayTracingPipelineCreateInfoKHR *)hash;
  hash_local = (Hash)this;
  pVVar3 = fake_handle<VkPipeline_T*>(hash);
  *_i = pVVar3;
  i_1._3_1_ = 0;
  bVar2 = filter_object(this,RESOURCE_RAYTRACING_PIPELINE,(Hash)create_info_local);
  if (bVar2) {
    for (local_30 = 0; local_30 < *(uint *)((long)pipeline_local + 0x14); local_30 = local_30 + 1) {
      bVar2 = filter_shader_module
                        (this,*(Hash *)(pipeline_local[3] + (ulong)local_30 * 0x30 + 0x18));
      if (bVar2) {
        i_1._3_1_ = 1;
        break;
      }
    }
    if (*(int *)((long)pipeline_local + 0x14) == 0) {
      i_1._3_1_ = 1;
    }
    for (local_34 = 0; local_34 < *(uint *)((long)pipeline_local + 0x14); local_34 = local_34 + 1) {
      _i_2 = *(key_type *)(pipeline_local[3] + (ulong)local_34 * 0x30 + 0x18);
      sVar4 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::count(&this->banned_modules,(key_type *)&i_2);
      if (sVar4 != 0) {
        i_1._3_1_ = 0;
        break;
      }
    }
    if (pipeline_local[7] != (VkPipeline)0x0) {
      local_41 = 0;
      for (local_48 = 0; local_48 < *(uint *)(pipeline_local[7] + 0x10); local_48 = local_48 + 1) {
        local_50 = *(key_type *)(*(long *)(pipeline_local[7] + 0x18) + (ulong)local_48 * 8);
        sVar4 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::count(&this->banned_raytracing,&local_50);
        if (sVar4 != 0) {
          i_1._3_1_ = 0;
          break;
        }
        bVar2 = false;
        if ((local_41 & 1) == 0) {
          local_58 = *(key_type *)(*(long *)(pipeline_local[7] + 0x18) + (ulong)local_48 * 8);
          sVar5 = std::
                  unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
                  ::count(&this->raytracing_pipelines,&local_58);
          bVar2 = sVar5 != 0;
        }
        if (bVar2) {
          local_41 = 1;
        }
        if ((*(int *)((long)pipeline_local + 0x14) == 0) && ((i_1._3_1_ & 1) != 0)) {
          i_1._3_1_ = local_41 & 1;
        }
      }
    }
    if ((((ulong)pipeline_local[2] & 0x800) != 0) && (*(int *)((long)pipeline_local + 0x14) == 0)) {
      i_1._3_1_ = 0;
    }
  }
  ppVVar1 = pipeline_local;
  if ((i_1._3_1_ & 1) == 0) {
    if (((ulong)pipeline_local[2] & 0x800) != 0) {
      ppVVar6 = std::
                unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
                ::operator[](&this->library_raytracing_pipelines,(key_type *)&create_info_local);
      *ppVVar6 = (mapped_type)ppVVar1;
    }
  }
  else {
    ppVVar6 = std::
              unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
              ::operator[](&this->raytracing_pipelines,(key_type *)&create_info_local);
    *ppVVar6 = (mapped_type)ppVVar1;
  }
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_RAYTRACING_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			if (create_info->pLibraryInfo)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
				{
					if (banned_raytracing.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library &&
					    raytracing_pipelines.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						has_default_allowed_library = true;
					}

					// At least one of the dependent libraries must be considered allowed to pass.
					if (create_info->stageCount == 0 && allow_pipeline)
						allow_pipeline = has_default_allowed_library;
				}
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			raytracing_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_raytracing_pipelines[hash] = create_info;

		return true;
	}